

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromFilm(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  LensElementInterface *pLVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  Float t;
  Float local_b8;
  float local_b4;
  Tuple3<pbrt::Normal3,_float> local_b0;
  uint local_a4;
  Ray local_a0;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Ray *local_48;
  WrapMode2D local_40;
  Image *local_38;
  
  local_a0.o.super_Tuple3<pbrt::Point3,_float>.z = -(rCamera->o).super_Tuple3<pbrt::Point3,_float>.z
  ;
  local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z =
       -(rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_a0.time = rCamera->time;
  local_a0.o.super_Tuple3<pbrt::Point3,_float>.x = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.x;
  local_a0.o.super_Tuple3<pbrt::Point3,_float>.y = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.y;
  local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x =
       (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.x;
  local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y =
       (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.y;
  local_a0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_38 = &this->apertureImage;
  auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
  local_40.wrap.values = (array<pbrt::WrapMode,_2>)(WrapMode  [2])0x100000001;
  local_b8 = 1.0;
  fVar18 = 0.0;
  uVar3 = (uint)(this->elementInterfaces).nStored;
  local_48 = rOut;
  do {
    uVar4 = uVar3 - 1;
    if ((int)uVar4 < 0) break;
    uVar5 = uVar4 & 0x7fffffff;
    pLVar1 = (this->elementInterfaces).ptr;
    fVar18 = fVar18 - pLVar1[uVar5].thickness;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    local_b0.z = 0.0;
    fVar20 = pLVar1[uVar5].curvatureRadius;
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      bVar2 = IntersectSphericalElement
                        (fVar20,fVar18 + fVar20,&local_a0,&local_b4,(Normal3f *)&local_b0);
      auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
      if (bVar2) goto LAB_003e2974;
LAB_003e2c83:
      bVar2 = false;
    }
    else {
      local_b4 = (fVar18 - local_a0.o.super_Tuple3<pbrt::Point3,_float>.z) /
                 local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z;
      if (local_b4 < 0.0) goto LAB_003e2c83;
LAB_003e2974:
      auVar12._0_4_ =
           local_b4 * local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x +
           local_a0.o.super_Tuple3<pbrt::Point3,_float>.x;
      auVar12._4_4_ =
           local_b4 * local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y +
           local_a0.o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar12._8_4_ = local_b4 * 0.0 + 0.0;
      auVar12._12_4_ = local_b4 * 0.0 + 0.0;
      fVar6 = local_b4 * local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z +
              local_a0.o.super_Tuple3<pbrt::Point3,_float>.z;
      if ((((fVar20 != 0.0) || (NAN(fVar20))) ||
          ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1)) ||
         ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
        auVar10._0_4_ = auVar12._0_4_ * auVar12._0_4_;
        auVar10._4_4_ = auVar12._4_4_ * auVar12._4_4_;
        auVar10._8_4_ = auVar12._8_4_ * auVar12._8_4_;
        auVar10._12_4_ = auVar12._12_4_ * auVar12._12_4_;
        auVar10 = vmovshdup_avx(auVar10);
        auVar10 = vfmadd231ss_fma(auVar10,auVar12,auVar12);
        if (auVar10._0_4_ <= pLVar1[uVar5].apertureRadius * pLVar1[uVar5].apertureRadius)
        goto LAB_003e2a87;
        goto LAB_003e2c83;
      }
      local_78._0_4_ = fVar6;
      auVar10 = vmovshdup_avx(auVar12);
      auVar10 = vinsertps_avx(ZEXT416((uint)((auVar12._0_4_ / pLVar1[uVar5].apertureRadius + 1.0) *
                                            0.5)),
                              ZEXT416((uint)(1.0 - (auVar10._0_4_ / pLVar1[uVar5].apertureRadius +
                                                   1.0) * 0.5)),0x10);
      bVar2 = false;
      local_68 = auVar12;
      local_b8 = Image::BilerpChannel(local_38,(Point2f)auVar10._0_8_,0,local_40);
      auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
      if ((local_b8 != 0.0) || (NAN(local_b8))) {
        fVar6 = (float)local_78._0_4_;
        auVar12 = local_68;
LAB_003e2a87:
        local_a0.o.super_Tuple3<pbrt::Point3,_float>.z = fVar6;
        local_a0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar12);
        bVar2 = true;
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          fVar20 = 1.0;
          if (uVar3 != 1) {
            fVar6 = (this->elementInterfaces).ptr[uVar3 - 2].eta;
            if ((fVar6 != 0.0) || (NAN(fVar6))) {
              fVar20 = fVar6;
            }
          }
          auVar15._8_8_ = 0;
          auVar15._0_4_ = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar15._4_4_ = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar8._0_4_ = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x *
                         local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar8._4_4_ = local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y *
                         local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar8._8_8_ = 0;
          auVar12 = vmovshdup_avx(auVar8);
          auVar12 = vfmadd231ss_fma(auVar12,auVar15,auVar15);
          auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)local_a0.d.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z));
          if (auVar12._0_4_ < 0.0) {
            local_68._0_4_ = pLVar1[uVar5].eta;
            local_58 = ZEXT416((uint)local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z);
            local_78 = auVar15;
            fVar21 = sqrtf(auVar12._0_4_);
            auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
            fVar6 = (float)local_68._0_4_;
            auVar15 = local_78;
            auVar12 = local_58;
          }
          else {
            auVar12 = vsqrtss_avx(auVar12,auVar12);
            fVar21 = auVar12._0_4_;
            fVar6 = pLVar1[uVar5].eta;
            auVar12 = ZEXT416((uint)local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z);
          }
          auVar11._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
          auVar11._8_4_ = auVar12._8_4_ ^ 0x80000000;
          auVar11._12_4_ = auVar12._12_4_ ^ 0x80000000;
          auVar14._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
          auVar14._8_4_ = auVar15._8_4_ ^ 0x80000000;
          auVar14._12_4_ = auVar15._12_4_ ^ 0x80000000;
          auVar16._4_4_ = fVar21;
          auVar16._0_4_ = fVar21;
          auVar16._8_4_ = fVar21;
          auVar16._12_4_ = fVar21;
          auVar10 = vdivps_avx(auVar14,auVar16);
          auVar15 = vmovshdup_avx(auVar10);
          auVar19._0_4_ = -auVar12._0_4_ / fVar21;
          auVar19._4_12_ = auVar11._4_12_;
          fVar20 = fVar20 / fVar6;
          auVar12 = vfmadd132ss_fma(auVar15,ZEXT416((uint)(auVar19._0_4_ * local_b0.z)),
                                    ZEXT416((uint)local_b0.y));
          auVar15 = vfmsub213ss_fma(ZEXT416((uint)local_b0.z),auVar19,
                                    ZEXT416((uint)(auVar19._0_4_ * local_b0.z)));
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ + auVar15._0_4_)),auVar10,
                                    ZEXT416((uint)local_b0.x));
          auVar12 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
          fVar6 = 0.0;
          auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x20);
          fVar21 = auVar12._0_4_ / (fVar20 * fVar20);
          auVar12 = ZEXT816(0) << 0x20;
          if (fVar21 < 1.0) {
            auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar21)),auVar17._0_16_);
            if (auVar12._0_4_ < 0.0) {
              local_68 = ZEXT416((uint)fVar20);
              local_58._0_4_ = fVar21;
              local_a4 = auVar15._0_4_;
              local_78 = auVar10;
              fVar6 = sqrtf(auVar12._0_4_);
              auVar15 = ZEXT416(local_a4);
              auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar21 = (float)local_58._0_4_;
              auVar10 = local_78;
              fVar20 = (float)local_68._0_4_;
            }
            else {
              auVar12 = vsqrtss_avx(auVar12,auVar12);
              fVar6 = auVar12._0_4_;
            }
            fVar6 = auVar15._0_4_ / fVar20 - fVar6;
            auVar13._4_4_ = fVar20;
            auVar13._0_4_ = fVar20;
            auVar13._8_4_ = fVar20;
            auVar13._12_4_ = fVar20;
            auVar12 = vdivps_avx(auVar10,auVar13);
            auVar9._0_4_ = fVar6 * local_b0.x;
            auVar9._4_4_ = fVar6 * local_b0.y;
            auVar9._8_4_ = fVar6 * 0.0;
            auVar9._12_4_ = fVar6 * 0.0;
            auVar12 = vsubps_avx(auVar9,auVar12);
            fVar6 = fVar6 * local_b0.z - auVar19._0_4_ / fVar20;
          }
          if (1.0 <= fVar21) goto LAB_003e2c83;
          local_a0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12);
          local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar6;
        }
      }
    }
    uVar3 = uVar4;
  } while (bVar2);
  FVar7 = 0.0;
  if (((int)uVar4 < 0) && (FVar7 = local_b8, local_48 != (Ray *)0x0)) {
    (local_48->o).super_Tuple3<pbrt::Point3,_float>.x =
         local_a0.o.super_Tuple3<pbrt::Point3,_float>.x;
    (local_48->o).super_Tuple3<pbrt::Point3,_float>.y =
         local_a0.o.super_Tuple3<pbrt::Point3,_float>.y;
    (local_48->o).super_Tuple3<pbrt::Point3,_float>.z =
         -local_a0.o.super_Tuple3<pbrt::Point3,_float>.z;
    (local_48->d).super_Tuple3<pbrt::Vector3,_float>.x =
         local_a0.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (local_48->d).super_Tuple3<pbrt::Vector3,_float>.y =
         local_a0.d.super_Tuple3<pbrt::Vector3,_float>.y;
    (local_48->d).super_Tuple3<pbrt::Vector3,_float>.z =
         -local_a0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_48->time = local_a0.time;
    (local_48->medium).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
  }
  return FVar7;
}

Assistant:

Float RealisticCamera::TraceLensesFromFilm(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = 0, weight = 1;
    // Transform _rCamera_ from camera to lens system space
    Ray rLens(Point3f(rCamera.o.x, rCamera.o.y, -rCamera.o.z),
              Vector3f(rCamera.d.x, rCamera.d.y, -rCamera.d.z), rCamera.time);

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Update ray from film accounting for interaction with _element_
        elementZ -= element.thickness;
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            // Compute _t_ at plane of aperture stop
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;

        } else {
            // Intersect ray with element to compute _t_ and _n_
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }
        DCHECK_GE(t, 0);

        // Test intersection point against element aperture
        Point3f pHit = rLens(t);
        if (isStop && apertureImage) {
            // Check intersection point against _apertureImage_
            Point2f uv((pHit.x / element.apertureRadius + 1) / 2,
                       (pHit.y / element.apertureRadius + 1) / 2);
            uv.y = 1 - uv.y;
            weight = apertureImage.BilerpChannel(uv, 0, WrapMode::Black);
            if (weight == 0)
                return 0;

        } else {
            // Check intersection point against spherical aperture
            Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
            if (r2 > element.apertureRadius * element.apertureRadius)
                return 0;
        }
        rLens.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f w;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &w))
                return 0;
            rLens.d = w;
        }
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);

    return weight;
}